

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP4Reader::InitBuffer
          (BP4Reader *this,TimePoint *timeoutInstant,Seconds *pollSeconds,Seconds *timeoutSeconds)

{
  bool bVar1;
  BP4Deserializer *activity;
  unsigned_long uVar2;
  size_t sVar3;
  duration<double,_std::ratio<1L,_1L>_> *in_RCX;
  string *in_RDI;
  char *__rhs;
  size_t fileSize;
  uint64_t expectedMinFileSize;
  size_t metadataIndexFileSize;
  size_t newIdxSize;
  char *in_stack_fffffffffffffcc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Seconds *in_stack_fffffffffffffcd8;
  allocator *paVar4;
  TimePoint *in_stack_fffffffffffffce0;
  BP4Reader *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf8;
  undefined8 in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  int commRank;
  string *in_stack_fffffffffffffd08;
  BP4Deserializer *in_stack_fffffffffffffd10;
  string *source;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  TransportMan *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  TransportMan *in_stack_fffffffffffffd40;
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [24];
  string *in_stack_fffffffffffffde0;
  size_t in_stack_fffffffffffffde8;
  BufferSTL *in_stack_fffffffffffffdf0;
  string local_1f8 [7];
  undefined1 in_stack_fffffffffffffe0f;
  string *in_stack_fffffffffffffe10;
  BP4Deserializer *in_stack_fffffffffffffe18;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [39];
  undefined1 local_111 [40];
  allocator local_e9;
  string local_e8 [38];
  undefined1 in_stack_ffffffffffffff3e;
  allocator in_stack_ffffffffffffff3f;
  size_t in_stack_ffffffffffffff40;
  BufferSTL *in_stack_ffffffffffffff48;
  BP4Deserializer *in_stack_ffffffffffffff50;
  allocator local_99;
  string local_98 [32];
  size_t local_78;
  uint64_t local_70;
  allocator<char> local_51;
  string local_50 [15];
  undefined1 in_stack_ffffffffffffffbf;
  undefined8 in_stack_ffffffffffffffc0;
  BufferSTL *in_stack_ffffffffffffffc8;
  BP4Deserializer *in_stack_ffffffffffffffd0;
  
  commRank = (int)((ulong)in_stack_fffffffffffffd00 >> 0x20);
  if ((*(int *)((long)&in_RDI[6].field_2 + *(long *)(*(long *)(in_RDI + 6) + -0x20)) == 0) &&
     (activity = (BP4Deserializer *)
                 transportman::TransportMan::GetFileSize
                           (in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28),
     in_stack_ffffffffffffffd0 = activity, activity != (BP4Deserializer *)0x0)) {
    in_stack_fffffffffffffd08 =
         (string *)(&in_RDI[8]._M_dataplus + *(long *)(*(long *)(in_RDI + 6) + -0x18));
    source = (string *)&local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_50,"allocating metadata index buffer, in call to BPFileReader Open",
               (allocator *)source);
    adios2::format::BufferSTL::Resize
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    __rhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &in_RDI[0x35]._M_string_length;
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0xa1d7d5);
    transportman::TransportMan::ReadFile
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30
               ,(size_t)in_stack_fffffffffffffd28,(size_t)in_RDI);
    local_70 = MetadataExpectedMinFileSize
                         (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                          (bool)in_stack_fffffffffffffe0f);
    local_78 = 0;
    do {
      local_78 = transportman::TransportMan::GetFileSize
                           (in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28);
      if (local_70 <= local_78) break;
      bVar1 = SleepOrQuit(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                          in_stack_fffffffffffffcd8);
    } while (bVar1);
    if (local_78 < local_70) {
      paVar4 = (allocator *)&stack0xffffffffffffff3f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffff40,"Engine",paVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"BP4Reader",&local_e9);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_111;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_111 + 1),"InitBuffer",(allocator *)__lhs);
      std::operator+((char *)in_stack_fffffffffffffd08,__rhs_00);
      commRank = (int)((ulong)__rhs_00 >> 0x20);
      std::operator+(__lhs,in_stack_fffffffffffffcc0);
      __rhs = (char *)std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(in_RCX);
      std::__cxx11::to_string((double)__lhs);
      std::operator+(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
      std::operator+(__lhs,__rhs);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffcf8);
      std::operator+(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
      std::operator+(__lhs,__rhs);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffcf8);
      std::operator+(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
      std::operator+(__lhs,__rhs);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffcf8);
      std::operator+(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
      std::operator+(__lhs,__rhs);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (in_RDI,source,(string *)activity,in_stack_fffffffffffffd08,commRank);
      std::__cxx11::string::~string(local_138);
      std::__cxx11::string::~string(local_158);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd28);
      std::__cxx11::string::~string(local_178);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string(local_2b8);
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::string::~string(local_298);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffde8);
      std::__cxx11::string::~string(local_278);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string(local_258);
      std::__cxx11::string::~string((string *)(local_111 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_111);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
      in_stack_fffffffffffffd10 = activity;
    }
    else {
      paVar4 = &local_99;
      std::allocator<char>::allocator();
      commRank = (int)((ulong)__rhs_00 >> 0x20);
      std::__cxx11::string::string
                (local_98,"allocating metadata buffer, in call to BP4Reader Open",paVar4);
      adios2::format::BufferSTL::Resize
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0xa1d99a);
      transportman::TransportMan::ReadFile
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 (size_t)in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,(size_t)in_RDI)
      ;
      *(uint64_t *)(in_RDI + 0x32) = local_70;
      *(BP4Deserializer **)((long)&in_RDI[0x37].field_2 + 8) = in_stack_ffffffffffffffd0;
      in_stack_fffffffffffffd10 = activity;
    }
  }
  uVar2 = helper::Comm::BroadcastValue<unsigned_long>
                    ((Comm *)in_stack_fffffffffffffd10,(unsigned_long *)in_stack_fffffffffffffd08,
                     commRank);
  if (uVar2 != 0) {
    helper::Comm::BroadcastVector<char>
              ((Comm *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               (int)((ulong)in_RDI >> 0x20));
    helper::Comm::BroadcastVector<char>
              ((Comm *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               (int)((ulong)in_RDI >> 0x20));
    adios2::format::BP4Deserializer::ParseMetadataIndex
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               (bool)in_stack_ffffffffffffff3f,(bool)in_stack_ffffffffffffff3e);
    in_RDI[0x3b].field_0x1 = 1;
    sVar3 = adios2::format::BP4Deserializer::ParseMetadata
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                       (Engine *)in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
    in_RDI[0x32]._M_string_length = sVar3;
  }
  return;
}

Assistant:

void BP4Reader::InitBuffer(const TimePoint &timeoutInstant, const Seconds &pollSeconds,
                           const Seconds &timeoutSeconds)
{
    size_t newIdxSize = 0;
    // Put all metadata in buffer
    if (m_BP4Deserializer.m_RankMPI == 0)
    {
        /* Read metadata index table into memory */
        const size_t metadataIndexFileSize = m_MDIndexFileManager.GetFileSize(0);
        if (metadataIndexFileSize > 0)
        {
            m_BP4Deserializer.m_MetadataIndex.Resize(metadataIndexFileSize,
                                                     "allocating metadata index buffer, "
                                                     "in call to BPFileReader Open");
            m_MDIndexFileManager.ReadFile(m_BP4Deserializer.m_MetadataIndex.m_Buffer.data(),
                                          metadataIndexFileSize);

            /* Read metadata file into memory but first make sure
             * it has the content that the index table refers to */
            uint64_t expectedMinFileSize =
                MetadataExpectedMinFileSize(m_BP4Deserializer, m_Name, true);
            size_t fileSize = 0;
            do
            {
                fileSize = m_MDFileManager.GetFileSize(0);
                if (fileSize >= expectedMinFileSize)
                {
                    break;
                }
            } while (SleepOrQuit(timeoutInstant, pollSeconds));

            if (fileSize >= expectedMinFileSize)
            {
                m_BP4Deserializer.m_Metadata.Resize(
                    expectedMinFileSize, "allocating metadata buffer, in call to BP4Reader Open");

                m_MDFileManager.ReadFile(m_BP4Deserializer.m_Metadata.m_Buffer.data(),
                                         expectedMinFileSize);
                m_MDFileAlreadyReadSize = expectedMinFileSize;
                m_MDIndexFileAlreadyReadSize = metadataIndexFileSize;
                newIdxSize = metadataIndexFileSize;
            }
            else
            {
                helper::Throw<std::ios_base::failure>(
                    "Engine", "BP4Reader", "InitBuffer",
                    "File " + m_Name +
                        " was found with an index file but md.0 "
                        "has not contained enough data within "
                        "the specified timeout of " +
                        std::to_string(timeoutSeconds.count()) +
                        " seconds. index size = " + std::to_string(metadataIndexFileSize) +
                        " metadata size = " + std::to_string(fileSize) +
                        " expected size = " + std::to_string(expectedMinFileSize) +
                        ". One reason could be if the reader finds old data "
                        "while "
                        "the writer is creating the new files.");
            }
        }
    }

    newIdxSize = m_Comm.BroadcastValue(newIdxSize, 0);

    if (newIdxSize > 0)
    {
        // broadcast buffer to all ranks from zero
        m_Comm.BroadcastVector(m_BP4Deserializer.m_Metadata.m_Buffer);

        // broadcast metadata index buffer to all ranks from zero
        m_Comm.BroadcastVector(m_BP4Deserializer.m_MetadataIndex.m_Buffer);

        /* Parse metadata index table */
        m_BP4Deserializer.ParseMetadataIndex(m_BP4Deserializer.m_MetadataIndex, 0, true, false);
        // now we are sure the index header has been parsed, first step parsing
        // done
        m_IdxHeaderParsed = true;

        // fills IO with Variables and Attributes
        m_MDFileProcessedSize =
            m_BP4Deserializer.ParseMetadata(m_BP4Deserializer.m_Metadata, *this, true);

        /* m_MDFileProcessedSize is the position in the buffer where processing
         * ends. The processing is controlled by the number of records in the
         * Index, which may be less than the actual entries in the metadata in a
         * streaming situation (where writer has just written metadata for step
         * K+1,...,K+L while the index contains K steps when the reader looks at
         * it).
         *
         * In ProcessMetadataForNewSteps(), we will re-read the metadata which
         * is in the buffer but has not been processed yet.
         */
    }
}